

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

void jrotate(double *A,int N,double a,double b,int i)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double w;
  double y;
  double den;
  double s;
  double c;
  int r1;
  int r;
  int j;
  int i_local;
  double b_local;
  double a_local;
  int N_local;
  double *A_local;
  
  iVar2 = i * N;
  r1 = i;
  if ((a != 0.0) || (NAN(a))) {
    dVar3 = sqrt(a * a + b * b);
    s = a / dVar3;
    den = b / dVar3;
  }
  else {
    s = 0.0;
    den = signx(b);
  }
  for (; r1 < N; r1 = r1 + 1) {
    dVar3 = A[iVar2 + r1];
    dVar1 = A[iVar2 + N + r1];
    A[iVar2 + r1] = s * dVar3 + -(den * dVar1);
    A[iVar2 + N + r1] = den * dVar3 + s * dVar1;
  }
  return;
}

Assistant:

static void jrotate(double *A,int N,double a,double b,int i) {
	int j,r,r1;
	double c,s,den,y,w;
	r = i * N;
	r1 = r + N;
	if (a == 0.0) {
		c = 0.0;
		s = signx(b);
	} else {
		den = sqrt(a*a+b*b);
		c = a / den;
		s = b / den;
	}
	
	for (j = i; j < N;++j) {
		y = A[r+j];
		w = A[r1+j];
		A[r+j] = c*y - s*w;
		A[r1+j] = s*y + c*w;
	}
}